

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type * __thiscall
FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>::val
          (value_type *__return_storage_ptr__,
          FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>
          *this)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  value_type local_30;
  
  dVar1 = (this->left_).constant_;
  FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>::val(&local_30,&this->right_->fadexpr_);
  __return_storage_ptr__->val_ = dVar1 - local_30.val_;
  lVar4 = (long)local_30.dx_.num_elts;
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if (lVar4 < 1) {
    __return_storage_ptr__->defaultVal = 0.0;
  }
  else {
    (__return_storage_ptr__->dx_).num_elts = local_30.dx_.num_elts;
    pdVar2 = (double *)operator_new__(lVar4 * 8);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar2;
    __return_storage_ptr__->defaultVal = 0.0;
    lVar3 = 0;
    do {
      pdVar2[lVar3] = -local_30.dx_.ptr_to_data[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar4 != lVar3);
  }
  Fad<double>::~Fad(&local_30);
  return __return_storage_ptr__;
}

Assistant:

const value_type val() const {return left_.val() - right_.val();}